

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

int Abc_SclCheckCommonInputs(Abc_Obj_t *pObj,Abc_Obj_t *pFanin)

{
  Abc_Obj_t *pFanin_00;
  int iVar1;
  char *pcVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if ((pObj->vFanins).nSize <= lVar3) {
      return 0;
    }
    pFanin_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar3]];
    iVar1 = Abc_NodeFindFanin(pFanin,pFanin_00);
    lVar3 = lVar3 + 1;
  } while (iVar1 < 0);
  printf("Node %d and its fanin %d have common fanin %d.\n",(ulong)(uint)pObj->Id,
         (ulong)(uint)pFanin->Id,(ulong)(uint)pFanin_00->Id);
  pcVar2 = Mio_GateReadName((Mio_Gate_t *)(pObj->field_5).pData);
  printf("%-16s : ",pcVar2);
  Abc_ObjPrint(_stdout,pObj);
  pcVar2 = Mio_GateReadName((Mio_Gate_t *)(pFanin->field_5).pData);
  printf("%-16s : ",pcVar2);
  Abc_ObjPrint(_stdout,pFanin);
  if ((Mio_Gate_t *)(pFanin_00->field_5).pData != (Mio_Gate_t *)0x0) {
    pcVar2 = Mio_GateReadName((Mio_Gate_t *)(pFanin_00->field_5).pData);
    printf("%-16s : ",pcVar2);
  }
  Abc_ObjPrint(_stdout,pFanin_00);
  return 1;
}

Assistant:

int Abc_SclCheckCommonInputs( Abc_Obj_t * pObj, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pTemp;
    int i;
    Abc_ObjForEachFanin( pObj, pTemp, i )
        if ( Abc_NodeFindFanin( pFanin, pTemp ) >= 0 )
        {
            printf( "Node %d and its fanin %d have common fanin %d.\n", Abc_ObjId(pObj), Abc_ObjId(pFanin), Abc_ObjId(pTemp) );

            printf( "%-16s : ", Mio_GateReadName((Mio_Gate_t *)pObj->pData) ); 
            Abc_ObjPrint( stdout, pObj );

            printf( "%-16s : ", Mio_GateReadName((Mio_Gate_t *)pFanin->pData) ); 
            Abc_ObjPrint( stdout, pFanin );

            if ( pTemp->pData )
            printf( "%-16s : ", Mio_GateReadName((Mio_Gate_t *)pTemp->pData) ); 
            Abc_ObjPrint( stdout, pTemp );
            return 1;
        }
    return 0;
}